

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_Bignum64.c
# Opt level: O3

void bn_slow_precomp(uint32_t len,uint64_t *n,uint64_t mu,uint64_t *r2,uint64_t *a,uint64_t *res)

{
  long lVar1;
  uint64_t *puVar2;
  uint64_t *r2_00;
  uint64_t *res_00;
  uint64_t *c;
  uint64_t uStack_50;
  uint64_t *local_48 [3];
  
  lVar1 = -((ulong)len * 8 + 0xf & 0xfffffffffffffff0);
  res_00 = (uint64_t *)((long)local_48 + lVar1);
  local_48[0] = res;
  local_48[1] = r2;
  local_48[2] = a;
  *(undefined8 *)((long)&uStack_50 + lVar1) = 0x1954b5;
  memset(res_00,0,(ulong)len << 3);
  puVar2 = local_48[2];
  c = res_00 + -(ulong)(len * 2);
  c[-1] = 0x1954d6;
  memcpy(c,puVar2,(ulong)(len * 2) * 8);
  c[-1] = 0x1954ea;
  Hacl_Bignum_AlmostMontgomery_bn_almost_mont_reduction_u64(len,n,mu,c,res_00);
  r2_00 = local_48[1];
  puVar2 = local_48[0];
  c[-1] = 0x195503;
  Hacl_Bignum_Montgomery_bn_to_mont_u64(len,n,mu,r2_00,res_00,puVar2);
  return;
}

Assistant:

static inline void
bn_slow_precomp(
  uint32_t len,
  uint64_t *n,
  uint64_t mu,
  uint64_t *r2,
  uint64_t *a,
  uint64_t *res
)
{
  KRML_CHECK_SIZE(sizeof (uint64_t), len);
  uint64_t a_mod[len];
  memset(a_mod, 0U, len * sizeof (uint64_t));
  KRML_CHECK_SIZE(sizeof (uint64_t), len + len);
  uint64_t a1[len + len];
  memset(a1, 0U, (len + len) * sizeof (uint64_t));
  memcpy(a1, a, (len + len) * sizeof (uint64_t));
  Hacl_Bignum_AlmostMontgomery_bn_almost_mont_reduction_u64(len, n, mu, a1, a_mod);
  Hacl_Bignum_Montgomery_bn_to_mont_u64(len, n, mu, r2, a_mod, res);
}